

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive.h
# Opt level: O2

sequence<acto::core::worker_t> __thiscall
acto::intrusive::mpsc_stack<acto::core::worker_t>::extract(mpsc_stack<acto::core::worker_t> *this)

{
  __pointer_type pwVar1;
  bool bVar2;
  atomic<acto::core::worker_t_*> *in_RSI;
  worker_t *top;
  
  do {
    pwVar1 = (in_RSI->_M_b)._M_p;
    top = (__pointer_type)0x0;
    if (pwVar1 == (__pointer_type)0x0) break;
    top = pwVar1;
    bVar2 = std::atomic<acto::core::worker_t_*>::compare_exchange_weak
                      (in_RSI,&top,(__pointer_type)0x0,seq_cst);
  } while (!bVar2);
  (this->head_)._M_b._M_p = top;
  return (sequence<acto::core::worker_t>)(worker_t *)this;
}

Assistant:

sequence<T> extract() noexcept {
    do {
      T* top = head_.load(std::memory_order_relaxed);

      if (top == nullptr) {
        return sequence<T>{nullptr};
      }
      if (head_.compare_exchange_weak(top, nullptr)) {
        return sequence<T>{top};
      }
    } while (true);
  }